

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mconfig.cpp
# Opt level: O1

void MConfig::copyValue(void *dst,int type,QVariant *value)

{
  PrivateShared *pPVar1;
  char cVar2;
  bool bVar3;
  PrivateShared PVar4;
  QMetaType QVar5;
  undefined8 extraout_RAX;
  QMetaTypeInterface *pQVar6;
  uint *ptr;
  longlong lVar7;
  QArrayData *pQVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  QRectF t;
  QUrl in_stack_ffffffffffffffc8;
  QUrl QVar11;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  char *local_28;
  qsizetype qStack_20;
  
  cVar2 = QVariant::isNull();
  if (cVar2 != '\0') {
    return;
  }
  switch(type) {
  case 1:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107cef);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      PVar4 = *(PrivateShared *)value;
    }
    else {
      PVar4 = (PrivateShared)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e608,&stack0xffffffffffffffc8);
    }
    *(PrivateShared *)dst = PVar4;
    break;
  case 2:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107e9f);
    if (bVar3) goto LAB_00107ea7;
    uVar9 = 0;
    QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if (((value->d).field_0x18 & 1) != 0) {
      pPVar1 = (value->d).data.shared;
      value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType;
LAB_001081c3:
    QMetaType::convert(QVar5,value,(QMetaType)pQVar6,&stack0xffffffffffffffc8);
    goto LAB_001081d7;
  case 3:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107e00);
    if (!bVar3) {
      uVar9 = 0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_int>::metaType;
      goto LAB_001081c3;
    }
LAB_00107ea7:
    if (((value->d).field_0x18 & 1) != 0) {
      pPVar1 = (value->d).data.shared;
      value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    uVar9 = *(undefined4 *)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
LAB_001081d7:
    *(undefined4 *)dst = uVar9;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x12:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
switchD_00107cd9_caseD_4:
    copyValue((MConfig *)&stack0xffffffffffffffc8);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffc8);
    _Unwind_Resume(extraout_RAX);
  case 10:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107da9);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QVar11.d = (QUrlPrivate *)(((Private *)&((PrivateShared *)value)->field_0x0)->data).shared;
      _uStack_30 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
      local_28 = *(char **)&((PrivateShared *)((long)value + 0x10))->field_0x0;
      if (QVar11.d != (QUrlPrivate *)0x0) {
        LOCK();
        *(int *)QVar11.d = *(int *)QVar11.d + 1;
        UNLOCK();
      }
    }
    else {
      QVar11.d = (QUrlPrivate *)0x0;
      _uStack_30 = (Data *)0x0;
      local_28 = (char *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e598,&stack0xffffffffffffffc8);
    }
    pQVar8 = *dst;
    *(QUrlPrivate **)dst = QVar11.d;
    *(Data **)((long)dst + 8) = _uStack_30;
    *(char **)((long)dst + 0x10) = local_28;
    if (pQVar8 == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
    lVar7 = 2;
    goto LAB_0010818d;
  case 0xc:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107e48);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QVar11.d = (QUrlPrivate *)(((Private *)&((PrivateShared *)value)->field_0x0)->data).shared;
      _uStack_30 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
      local_28 = *(char **)&((PrivateShared *)((long)value + 0x10))->field_0x0;
      if (QVar11.d != (QUrlPrivate *)0x0) {
        LOCK();
        *(int *)QVar11.d = *(int *)QVar11.d + 1;
        UNLOCK();
      }
    }
    else {
      QVar11.d = (QUrlPrivate *)0x0;
      _uStack_30 = (Data *)0x0;
      local_28 = (char *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e528,&stack0xffffffffffffffc8);
    }
    pQVar8 = *dst;
    *(QUrlPrivate **)dst = QVar11.d;
    *(Data **)((long)dst + 8) = _uStack_30;
    *(char **)((long)dst + 0x10) = local_28;
    if (pQVar8 == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
    lVar7 = 1;
LAB_0010818d:
    QArrayData::deallocate(pQVar8,lVar7,8);
    break;
  case 0x10:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107f11);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QDateTime::QDateTime((QDateTime *)&stack0xffffffffffffffc8,(QDateTime *)value);
    }
    else {
      QDateTime::QDateTime((QDateTime *)&stack0xffffffffffffffc8);
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e8a8,&stack0xffffffffffffffc8);
    }
    *(QUrlPrivate **)dst = in_stack_ffffffffffffffc8.d;
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffc8);
    break;
  case 0x11:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107ed4);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QUrl::QUrl((QUrl *)&stack0xffffffffffffffc8,(QUrl *)value);
    }
    else {
      QUrl::QUrl((QUrl *)&stack0xffffffffffffffc8);
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e918,&stack0xffffffffffffffc8);
    }
    *(QUrlPrivate **)dst = in_stack_ffffffffffffffc8.d;
    QUrl::~QUrl((QUrl *)&stack0xffffffffffffffc8);
    break;
  case 0x13:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107f4e);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QVar11.d = *(QUrlPrivate **)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
      _uStack_30 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
    }
    else {
      QVar11.d = (QUrlPrivate *)0x0;
      _uStack_30 = (Data *)0xffffffffffffffff;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e7c8,&stack0xffffffffffffffc8);
    }
    uVar9 = SUB84(QVar11.d,0);
    uVar10 = (undefined4)((ulong)QVar11.d >> 0x20);
    goto LAB_001082b9;
  case 0x14:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107d65);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QVar11.d = *(QUrlPrivate **)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
      _uStack_30 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
      local_28 = *(char **)&((PrivateShared *)((long)value + 0x10))->field_0x0;
      qStack_20 = *(qsizetype *)&((PrivateShared *)((long)value + 0x18))->field_0x0;
    }
    else {
      local_28 = (char *)0x0;
      qStack_20 = 0;
      QVar11.d = (QUrlPrivate *)0x0;
      _uStack_30 = (Data *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e838,&stack0xffffffffffffffc8);
    }
    uVar9 = SUB84(QVar11.d,0);
    uVar10 = (undefined4)((ulong)QVar11.d >> 0x20);
    *(char **)((long)dst + 0x10) = local_28;
    *(qsizetype *)((long)dst + 0x18) = qStack_20;
LAB_001082b9:
    *(undefined4 *)dst = uVar9;
    *(undefined4 *)((long)dst + 4) = uVar10;
    *(undefined4 *)((long)dst + 8) = uStack_30;
    *(undefined4 *)((long)dst + 0xc) = uStack_2c;
    break;
  case 0x19:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107f88);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QVar11.d = (QUrlPrivate *)(((Private *)&((PrivateShared *)value)->field_0x0)->data).shared;
    }
    else {
      QVar11.d = (QUrlPrivate *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e6e8,&stack0xffffffffffffffc8);
    }
    *(QUrlPrivate **)dst = QVar11.d;
    break;
  case 0x1a:
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107fc1);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QVar11.d = (QUrlPrivate *)(((Private *)&((PrivateShared *)value)->field_0x0)->data).shared;
      _uStack_30 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
    }
    else {
      QVar11.d = (QUrlPrivate *)0x0;
      _uStack_30 = (Data *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e758,&stack0xffffffffffffffc8);
    }
    *(QUrlPrivate **)dst = QVar11.d;
    *(Data **)((long)dst + 8) = _uStack_30;
    break;
  default:
    if (type != 0x26) goto switchD_00107cd9_caseD_4;
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffffc8.d,(QMetaType)0x107d2e);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      uVar9 = *(undefined4 *)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
    }
    else {
      uVar9 = 0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10e678,&stack0xffffffffffffffc8);
    }
    *(undefined4 *)dst = uVar9;
  }
  return;
}

Assistant:

void MConfig::copyValue(void *dst, int type, const QVariant &value)
{
    if (value.isNull()) {
        return;
    }

    // In Qt6 arguments of QVariant::canConvert has changed (QVariant::Type is deprecated)
    #if QT_VERSION >= 0x060000
        #define TYPE QMetaType
    #else
        #define TYPE int
    #endif
    Q_ASSERT(value.canConvert(TYPE(type)));
    #undef TYPE

    switch (type) {
        case QMetaType::Int:
            COPY_TYPE(int)
        case QMetaType::UInt:
            COPY_TYPE(uint)
        case QMetaType::QByteArray:
            COPY_TYPE(QByteArray)
        case QMetaType::QString:
            COPY_TYPE(QString)
        case QMetaType::Bool:
            COPY_TYPE(bool)
        case QMetaType::Float:
            COPY_TYPE(float)
        case QMetaType::QPoint:
            COPY_TYPE(QPoint)
        case QMetaType::QPointF:
            COPY_TYPE(QPointF)
        case QMetaType::QRect:
            COPY_TYPE(QRect)
        case QMetaType::QRectF:
            COPY_TYPE(QRectF)
        case QMetaType::QDateTime:
            COPY_TYPE(QDateTime)
        case QMetaType::QUrl:
            COPY_TYPE(QUrl)
        default:
            qFatal("Config: type unsupported!");
    }
}